

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AuxPtrs.h
# Opt level: O2

void Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>::AllocAuxPtrFix
               (FunctionProxy *host,uint8 size)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Recycler *pRVar4;
  AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *ptr;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  pRVar4 = host->m_scriptContext->recycler;
  if (pRVar4 == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                ,0xab,"(recycler != nullptr)","recycler != nullptr");
    if (!bVar2) goto LAB_006dee5e;
    *puVar3 = 0;
  }
  if (size == ' ') {
    local_50 = (undefined1  [8])
               &AuxPtrsFix<Js::FunctionProxy::AuxPointerType,(unsigned_char)32,(unsigned_char)3>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2a0e449;
    data.filename._0_4_ = 0xb3;
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_50);
    ptr = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
          new<Memory::Recycler>(0x20,pRVar4,0x5216f8,0);
    AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)'_',_(unsigned_char)'\x03'>::
    AuxPtrsFix((AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)___,_(unsigned_char)__x03_>
                *)ptr,(AuxPtrsFix<Js::FunctionProxy::AuxPointerType,_(unsigned_char)__x10_,_(unsigned_char)__x01_>
                       *)(host->auxPtrs).ptr);
  }
  else {
    if (size != '\x10') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/AuxPtrs.h"
                                  ,0xb7,"(false)","false");
      if (bVar2) {
        *puVar3 = 0;
        return;
      }
LAB_006dee5e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    local_50 = (undefined1  [8])
               &AuxPtrsFix<Js::FunctionProxy::AuxPointerType,(unsigned_char)16,(unsigned_char)1>::
                typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2a0e449;
    data.filename._0_4_ = 0xaf;
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_50);
    ptr = (AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType> *)
          new<Memory::Recycler>(0x10,pRVar4,0x5216f8);
    ptr->offsets[6] = '\0';
    ptr->offsets[7] = '\0';
    ptr->offsets[8] = '\0';
    ptr->offsets[9] = '\0';
    ptr->offsets[10] = '\0';
    ptr->offsets[0xb] = '\0';
    ptr->offsets[0xc] = '\0';
    ptr->offsets[0xd] = '\0';
    ptr->count = '\x01';
    ptr->capacity = 0xff;
  }
  Memory::WriteBarrierPtr<Js::AuxPtrs<Js::FunctionProxy,_Js::FunctionProxy::AuxPointerType>_>::
  WriteBarrierSet(&host->auxPtrs,ptr);
  return;
}

Assistant:

void AuxPtrs<T, FieldsEnum>::AllocAuxPtrFix(T* host, uint8 size)
    {
        Recycler* recycler = host->GetRecycler();
        Assert(recycler != nullptr);

        if (size == 16)
        {
            host->auxPtrs = (AuxPtrs<T, FieldsEnum>*)RecyclerNewWithBarrierStructZ(recycler, AuxPtrs16);
        }
        else if (size == 32)
        {
            host->auxPtrs = (AuxPtrs<T, FieldsEnum>*)RecyclerNewWithBarrierPlusZ(recycler, 0, AuxPtrs32, (AuxPtrs16*)(void*)host->auxPtrs);
        }
        else
        {
            Assert(false);
        }
    }